

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.h
# Opt level: O2

void __thiscall FBX::Settings::Settings(Settings *this,Node *node)

{
  int iVar1;
  int iVar2;
  Vector3 VVar3;
  allocator<char> local_72;
  allocator<char> local_71;
  int local_70 [2];
  string local_68;
  undefined1 local_48 [32];
  double local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"UpAxis",&local_71);
  local_70[0] = 2;
  iVar1 = getProperty<int>(node,&local_68,local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"UpAxisSign",&local_72);
  local_70[1] = 1;
  iVar2 = getProperty<int>(node,(string *)local_48,local_70 + 1);
  VVar3 = parseAxis(iVar1,iVar2);
  this->upAxis = VVar3;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"FrontAxis",&local_71);
  local_70[0] = 2;
  iVar1 = getProperty<int>(node,&local_68,local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"FrontAxisSign",&local_72);
  local_70[1] = 1;
  iVar2 = getProperty<int>(node,(string *)local_48,local_70 + 1);
  VVar3 = parseAxis(iVar1,iVar2);
  this->frontAxis = VVar3;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CoordAxis",&local_71);
  local_70[0] = 2;
  iVar1 = getProperty<int>(node,&local_68,local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"CoordAxisSign",&local_72);
  local_70[1] = 1;
  iVar2 = getProperty<int>(node,(string *)local_48,local_70 + 1);
  VVar3 = parseAxis(iVar1,iVar2);
  this->coordAxis = VVar3;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"OriginalUpAxis",&local_71)
  ;
  local_70[0] = 2;
  iVar1 = getProperty<int>(node,&local_68,local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"OriginalUpAxisSign",&local_72);
  local_70[1] = 1;
  iVar2 = getProperty<int>(node,(string *)local_48,local_70 + 1);
  VVar3 = parseAxis(iVar1,iVar2);
  this->originalUpAxis = VVar3;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"UnitScaleFactor",(allocator<char> *)local_70);
  local_48._0_8_ = (pointer)0x3ff0000000000000;
  local_28 = getProperty<double>(node,&local_68,(double *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this->unitScaleFactor = local_28;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"OriginalUnitScaleFactor",(allocator<char> *)local_70);
  local_48._0_8_ = (pointer)0x3ff0000000000000;
  local_28 = getProperty<double>(node,&local_68,(double *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this->originalUnitScaleFactor = local_28;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"AmbientColor",(allocator<char> *)local_70);
  local_48._8_4_ = 0.0;
  local_48._0_8_ = (pointer)0x0;
  VVar3 = getProperty(node,&local_68,(Vector3 *)local_48);
  this->ambientColor = VVar3;
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

explicit Settings(const Node &node)
                : upAxis(parseAxis(getProperty<int32_t>(node, "UpAxis", 2),
                                   getProperty<int32_t>(node, "UpAxisSign", 1))),
                  frontAxis(parseAxis(getProperty<int32_t>(node, "FrontAxis", 2),
                                      getProperty<int32_t>(node, "FrontAxisSign", 1))),
                  coordAxis(parseAxis(getProperty<int32_t>(node, "CoordAxis", 2),
                                      getProperty<int32_t>(node, "CoordAxisSign", 1))),
                  originalUpAxis(parseAxis(getProperty<int32_t>(node, "OriginalUpAxis", 2),
                                           getProperty<int32_t>(node, "OriginalUpAxisSign", 1))),
                  unitScaleFactor(getProperty<double>(node, "UnitScaleFactor", 1.0)),
                  originalUnitScaleFactor(getProperty<double>(node, "OriginalUnitScaleFactor", 1.0)),
                  ambientColor(getProperty(node, "AmbientColor", {})) {}